

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O2

bool __thiscall llvm::DWARFFormValue::isFormClass(DWARFFormValue *this,FormClass FC)

{
  Form FVar1;
  ulong uVar2;
  bool bVar3;
  
  FVar1 = this->Form;
  uVar2 = (ulong)FVar1;
  if ((0x2c < uVar2) || (bVar3 = true, DWARF5FormClasses[uVar2] != FC)) {
    if (uVar2 == 0x1f01) {
      bVar3 = FC == FC_Address;
    }
    else if ((FVar1 == DW_FORM_GNU_str_index) || (FVar1 == DW_FORM_GNU_strp_alt)) {
      bVar3 = FC == FC_String;
    }
    else if (FVar1 == DW_FORM_GNU_ref_alt) {
      bVar3 = FC == FC_Reference;
    }
    else {
      if (FC != FC_SectionOffset) {
        return false;
      }
      bVar3 = true;
      if (FVar1 - 6 < 2) {
        if (this->U != (DWARFUnit *)0x0) {
          return (this->U->Header).FormParams.Version < 4;
        }
      }
      else if ((FVar1 != DW_FORM_strp) && (FVar1 != DW_FORM_line_strp)) {
        return false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool DWARFFormValue::isFormClass(DWARFFormValue::FormClass FC) const {
  // First, check DWARF5 form classes.
  if (Form < makeArrayRef(DWARF5FormClasses).size() &&
      DWARF5FormClasses[Form] == FC)
    return true;
  // Check more forms from extensions and proposals.
  switch (Form) {
  case DW_FORM_GNU_ref_alt:
    return (FC == FC_Reference);
  case DW_FORM_GNU_addr_index:
    return (FC == FC_Address);
  case DW_FORM_GNU_str_index:
  case DW_FORM_GNU_strp_alt:
    return (FC == FC_String);
  default:
    break;
  }

  if (FC == FC_SectionOffset) {
    if (Form == DW_FORM_strp || Form == DW_FORM_line_strp)
      return true;
    // In DWARF3 DW_FORM_data4 and DW_FORM_data8 served also as a section
    // offset. If we don't have a DWARFUnit, default to the old behavior.
    if (Form == DW_FORM_data4 || Form == DW_FORM_data8)
      return !U || U->getVersion() <= 3;
  }

  return false;
}